

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScapeGoatTree.cpp
# Opt level: O1

bool __thiscall ScapeGoatTree::removeBST(ScapeGoatTree *this,int value)

{
  int iVar1;
  Node *child;
  Node *pNVar2;
  Node *loc;
  Node *par;
  
  loc = this->root;
  if (loc != (Node *)0x0) {
    if (loc->value == value) {
      par = (Node *)0x0;
    }
    else {
      pNVar2 = (&loc->rightChild)[value < loc->value];
      par = loc;
      if (pNVar2 == (Node *)0x0) {
LAB_00106b59:
        loc = (Node *)0x0;
      }
      else {
        iVar1 = pNVar2->value;
        loc = pNVar2;
        while (iVar1 != value) {
          pNVar2 = (&loc->rightChild)[value < iVar1];
          par = loc;
          if (pNVar2 == (Node *)0x0) goto LAB_00106b59;
          loc = pNVar2;
          iVar1 = pNVar2->value;
        }
      }
    }
    if (loc != (Node *)0x0) {
      if ((loc->leftChild == (Node *)0x0) && (loc->rightChild == (Node *)0x0)) {
        pNVar2 = (Node *)this;
        if ((par != (Node *)0x0) && (pNVar2 = (Node *)&par->leftChild, par->leftChild != loc)) {
          pNVar2 = par;
        }
        pNVar2->rightChild = (Node *)0x0;
      }
      if ((loc->leftChild != (Node *)0x0) && (loc->rightChild == (Node *)0x0)) {
        pNVar2 = (Node *)this;
        if ((par != (Node *)0x0) && (pNVar2 = (Node *)&par->leftChild, par->leftChild != loc)) {
          pNVar2 = par;
        }
        pNVar2->rightChild = loc->leftChild;
      }
      if ((loc->leftChild == (Node *)0x0) && (loc->rightChild != (Node *)0x0)) {
        pNVar2 = (Node *)this;
        if ((par != (Node *)0x0) && (pNVar2 = (Node *)&par->leftChild, par->leftChild != loc)) {
          pNVar2 = par;
        }
        pNVar2->rightChild = loc->rightChild;
      }
      if ((loc->leftChild != (Node *)0x0) && (loc->rightChild != (Node *)0x0)) {
        caseC(this,par,loc);
      }
      operator_delete(loc,0x20);
      return true;
    }
  }
  return false;
}

Assistant:

bool ScapeGoatTree::removeBST(int value) {
    Node *parent, *location;
    if (root == nullptr) {
        return false;
    }
    find(value, &parent, &location);
    if (location == nullptr) {
        return false;
    }
    if (location->leftChild == nullptr && location->rightChild == nullptr) {
        caseA(parent, location);
    }
    if (location->leftChild != nullptr && location->rightChild == nullptr) {
        caseB(parent, location);
    }
    if (location->leftChild == nullptr && location->rightChild != nullptr) {
        caseB(parent, location);
    }
    if (location->leftChild != nullptr && location->rightChild != nullptr) {
        caseC(parent, location);
    }
    delete location;
    return true;
}